

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  int model;
  UndoHistory history;
  Cmd cmd4;
  Cmd cmd3;
  Cmd cmd2;
  Cmd cmd1;
  uint local_ac [2];
  bool local_a1;
  UndoHistory local_a0;
  UndoCommand local_78;
  uint *local_70;
  undefined8 local_68;
  UndoCommand local_60;
  uint *local_58;
  undefined8 local_50;
  UndoCommand local_48;
  uint *local_40;
  undefined8 local_38;
  UndoCommand local_30;
  uint *local_28;
  undefined8 local_20;
  
  local_70 = local_ac + 1;
  local_ac[1] = 0;
  local_30._vptr_UndoCommand = (_func_int **)&PTR__UndoCommand_00103d38;
  local_20 = 1;
  local_48._vptr_UndoCommand = (_func_int **)&PTR__UndoCommand_00103d38;
  local_38 = 0x100000002;
  local_60._vptr_UndoCommand = (_func_int **)&PTR__UndoCommand_00103d38;
  local_50 = 0x100000003;
  local_78._vptr_UndoCommand = (_func_int **)&PTR__UndoCommand_00103d38;
  local_68 = 0x300000004;
  local_58 = local_70;
  local_40 = local_70;
  local_28 = local_70;
  undo::UndoHistory::UndoHistory(&local_a0,(UndoHistoryDelegate *)0x0);
  local_ac[1] = 1;
  undo::UndoHistory::add(&local_a0,&local_30);
  local_ac[1] = 2;
  undo::UndoHistory::add(&local_a0,&local_48);
  undo::UndoHistory::undo(&local_a0);
  *local_58 = (uint)local_50;
  undo::UndoHistory::add(&local_a0,&local_60);
  *local_70 = (uint)local_68;
  undo::UndoHistory::add(&local_a0,&local_78);
  local_ac[0] = 4;
  expect_eq<int,int>((int *)local_ac,(int *)(local_ac + 1),
                     "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]undo/tests/tree.cpp"
                     ,0x20);
  undo::UndoHistory::undo(&local_a0);
  local_ac[0] = 3;
  expect_eq<int,int>((int *)local_ac,(int *)(local_ac + 1),
                     "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]undo/tests/tree.cpp"
                     ,0x22);
  undo::UndoHistory::undo(&local_a0);
  local_ac[0] = 2;
  expect_eq<int,int>((int *)local_ac,(int *)(local_ac + 1),
                     "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]undo/tests/tree.cpp"
                     ,0x24);
  undo::UndoHistory::undo(&local_a0);
  local_ac[0] = 1;
  expect_eq<int,int>((int *)local_ac,(int *)(local_ac + 1),
                     "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]undo/tests/tree.cpp"
                     ,0x26);
  undo::UndoHistory::undo(&local_a0);
  local_ac[0] = 0;
  expect_eq<int,int>((int *)local_ac,(int *)(local_ac + 1),
                     "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]undo/tests/tree.cpp"
                     ,0x28);
  local_ac[0] = local_ac[0] & 0xffffff00;
  local_a1 = undo::UndoHistory::canUndo(&local_a0);
  expect_eq<bool,bool>
            ((bool *)local_ac,&local_a1,
             "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]undo/tests/tree.cpp",0x29);
  undo::UndoHistory::redo(&local_a0);
  local_ac[0] = 1;
  expect_eq<int,int>((int *)local_ac,(int *)(local_ac + 1),
                     "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]undo/tests/tree.cpp"
                     ,0x2b);
  undo::UndoHistory::redo(&local_a0);
  local_ac[0] = 2;
  expect_eq<int,int>((int *)local_ac,(int *)(local_ac + 1),
                     "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]undo/tests/tree.cpp"
                     ,0x2d);
  undo::UndoHistory::redo(&local_a0);
  local_ac[0] = 3;
  expect_eq<int,int>((int *)local_ac,(int *)(local_ac + 1),
                     "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]undo/tests/tree.cpp"
                     ,0x2f);
  undo::UndoHistory::redo(&local_a0);
  local_ac[0] = 4;
  expect_eq<int,int>((int *)local_ac,(int *)(local_ac + 1),
                     "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]undo/tests/tree.cpp"
                     ,0x31);
  local_ac[0] = local_ac[0] & 0xffffff00;
  local_a1 = undo::UndoHistory::canRedo(&local_a0);
  expect_eq<bool,bool>
            ((bool *)local_ac,&local_a1,
             "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]undo/tests/tree.cpp",0x32);
  undo::UndoHistory::~UndoHistory(&local_a0);
  return 0;
}

Assistant:

int main(int argc, char** argv)
{
  // 1 --- 2
  // |
  //  ------- 3 --- 4
  int model = 0;
  Cmd cmd1(model, 1, 0);
  Cmd cmd2(model, 2, 1);
  Cmd cmd3(model, 3, 1);
  Cmd cmd4(model, 4, 3);

  UndoHistory history;
  cmd1.redo(); history.add(&cmd1);
  cmd2.redo(); history.add(&cmd2);
  history.undo();
  cmd3.redo(); history.add(&cmd3); // Creates a branch in the history
  cmd4.redo(); history.add(&cmd4);

  EXPECT_EQ(4, model);
  history.undo();
  EXPECT_EQ(3, model);
  history.undo();
  EXPECT_EQ(2, model);
  history.undo();
  EXPECT_EQ(1, model);
  history.undo();
  EXPECT_EQ(0,  model);
  EXPECT_FALSE(history.canUndo());
  history.redo();
  EXPECT_EQ(1, model);
  history.redo();
  EXPECT_EQ(2, model);
  history.redo();
  EXPECT_EQ(3, model);
  history.redo();
  EXPECT_EQ(4,  model);
  EXPECT_FALSE(history.canRedo());
}